

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O1

void bitset_inplace_intersection(bitset_t *b1,bitset_t *b2)

{
  ulong uVar1;
  uint64_t *puVar2;
  uint64_t *puVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = b1->arraysize;
  uVar5 = b2->arraysize;
  if (uVar1 < b2->arraysize) {
    uVar5 = uVar1;
  }
  if (uVar5 == 0) {
    uVar4 = 0;
  }
  else {
    puVar2 = b2->array;
    puVar3 = b1->array;
    uVar4 = 0;
    do {
      puVar3[uVar4] = puVar3[uVar4] & puVar2[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  if (uVar1 < uVar4 || uVar1 - uVar4 == 0) {
    return;
  }
  memset(b1->array + uVar4,0,(uVar1 - uVar4) * 8);
  return;
}

Assistant:

void bitset_inplace_intersection(bitset_t *CROARING_CBITSET_RESTRICT b1,
                                 const bitset_t *CROARING_CBITSET_RESTRICT b2) {
    size_t minlength =
        b1->arraysize < b2->arraysize ? b1->arraysize : b2->arraysize;
    size_t k = 0;
    for (; k < minlength; ++k) {
        b1->array[k] &= b2->array[k];
    }
    for (; k < b1->arraysize; ++k) {
        b1->array[k] = 0;  // memset could, maybe, be a tiny bit faster
    }
}